

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::iterate(BlendFuncCase *this)

{
  GLenum *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLenum *pGVar3;
  int *piVar4;
  TestLog *pTVar5;
  int iVar6;
  GLenum err;
  undefined4 extraout_var;
  int iVar7;
  undefined *puVar8;
  GLuint GVar9;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  GLint local_e4;
  ScopedLogSection local_e0;
  string local_d8;
  CallLogWrapper local_b8;
  string local_a0;
  ResultCollector local_80;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_b8,(Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar5,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_e4 = 0;
  local_b8.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_b8,0x8824,&local_e4);
  err = glu::CallLogWrapper::glGetError(&local_b8);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x428);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Initial","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,1,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,0,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,iVar6,1,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,iVar6,0,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingCommon","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"After setting common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendFunc(&local_b8,0x302,0x304);
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,0x302,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,0x304,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,iVar6,0x302,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,iVar6,0x304,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterSettingCommonSeparate","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"After setting common separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendFuncSeparate(&local_b8,0x300,0x303,0x306,0x305);
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,0x300,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,0x303,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,iVar6,0x306,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,iVar6,0x305,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingIndexed","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"After setting indexed","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar10 = &DAT_00993710;
  puVar8 = &DAT_00993714;
  uVar12 = 1;
  for (uVar11 = 0; (int)(GLuint)uVar11 < local_e4; uVar11 = uVar11 + 1) {
    pGVar1 = puVar10 + (uVar11 / 0xf) * -0xf;
    pGVar3 = (GLenum *)(puVar8 + (uVar12 / 0xf) * -0x3c);
    puVar10 = puVar10 + 1;
    puVar8 = puVar8 + 4;
    uVar12 = uVar12 + 1;
    glu::CallLogWrapper::glBlendFunci(&local_b8,(GLuint)uVar11,*pGVar1,*pGVar3);
  }
  if (0 < local_e4) {
    puVar10 = &DAT_00993710;
    uVar11 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,(int)uVar11,puVar10[(uVar11 / 0xf) * -0xf],
                 this->m_verifierType);
      uVar11 = uVar11 + 1;
      puVar10 = puVar10 + 1;
    } while ((int)uVar11 < local_e4);
  }
  puVar8 = &DAT_00993714;
  uVar11 = 1;
  for (iVar6 = 0; iVar6 < local_e4; iVar6 = iVar6 + 1) {
    piVar4 = (int *)(puVar8 + (uVar11 / 0xf) * -0x3c);
    puVar8 = puVar8 + 4;
    uVar11 = uVar11 + 1;
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&local_80,&local_b8,0x80c8,iVar6,*piVar4,this->m_verifierType);
  }
  if (0 < local_e4) {
    puVar10 = &DAT_00993710;
    uVar11 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,(int)uVar11,puVar10[(uVar11 / 0xf) * -0xf],
                 this->m_verifierType);
      uVar11 = uVar11 + 1;
      puVar10 = puVar10 + 1;
    } while ((int)uVar11 < local_e4);
  }
  puVar8 = &DAT_00993714;
  uVar11 = 1;
  for (iVar6 = 0; iVar6 < local_e4; iVar6 = iVar6 + 1) {
    piVar4 = (int *)(puVar8 + (uVar11 / 0xf) * -0x3c);
    puVar8 = puVar8 + 4;
    uVar11 = uVar11 + 1;
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&local_80,&local_b8,0x80ca,iVar6,*piVar4,this->m_verifierType);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterSettingIndexedSeparate","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"After setting indexed separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar8 = &DAT_00993714;
  uVar12 = 1;
  puVar10 = &DAT_00993710;
  for (uVar11 = 0; GVar9 = (GLuint)uVar11, (int)GVar9 < local_e4; uVar11 = uVar11 + 1) {
    iVar6 = (int)((ulong)((long)(int)(GVar9 + 3) * -0x77777777) >> 0x20) + GVar9 + 3;
    iVar7 = (int)((ulong)((long)(int)(GVar9 + 2) * -0x77777777) >> 0x20) + GVar9 + 2;
    pGVar3 = (GLenum *)(puVar8 + (uVar12 / 0xf) * -0x3c);
    pGVar1 = puVar10 + (uVar11 / 0xf) * -0xf;
    puVar10 = puVar10 + 1;
    puVar8 = puVar8 + 4;
    uVar12 = uVar12 + 1;
    glu::CallLogWrapper::glBlendFuncSeparatei
              (&local_b8,GVar9,
               (&DAT_00993710)[(int)(((iVar6 >> 3) - (iVar6 >> 0x1f)) * -0xf + GVar9 + 3)],
               (&DAT_00993710)[(int)(((iVar7 >> 3) - (iVar7 >> 0x1f)) * -0xf + GVar9 + 2)],*pGVar3,
               *pGVar1);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      iVar7 = (int)((ulong)((long)(iVar6 + 3) * -0x77777777) >> 0x20) + iVar6 + 3;
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,
                 (&DAT_00993710)[((iVar7 >> 3) - (iVar7 >> 0x1f)) * -0xf + iVar6 + 3],
                 this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      iVar7 = (int)((ulong)((long)(iVar6 + 2) * -0x77777777) >> 0x20) + iVar6 + 2;
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,
                 (&DAT_00993710)[((iVar7 >> 3) - (iVar7 >> 0x1f)) * -0xf + iVar6 + 2],
                 this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  puVar8 = &DAT_00993714;
  uVar11 = 1;
  for (iVar6 = 0; iVar6 < local_e4; iVar6 = iVar6 + 1) {
    piVar4 = (int *)(puVar8 + (uVar11 / 0xf) * -0x3c);
    puVar8 = puVar8 + 4;
    uVar11 = uVar11 + 1;
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&local_80,&local_b8,0x80cb,iVar6,*piVar4,this->m_verifierType);
  }
  if (0 < local_e4) {
    puVar10 = &DAT_00993710;
    uVar11 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,(int)uVar11,puVar10[(uVar11 / 0xf) * -0xf],
                 this->m_verifierType);
      uVar11 = uVar11 + 1;
      puVar10 = puVar10 + 1;
    } while ((int)uVar11 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommon","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"After resetting indexed with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar10 = &DAT_00993710;
  puVar8 = &DAT_00993714;
  uVar12 = 1;
  for (uVar11 = 0; (int)(GLuint)uVar11 < local_e4; uVar11 = uVar11 + 1) {
    pGVar1 = puVar10 + (uVar11 / 0xf) * -0xf;
    pGVar3 = (GLenum *)(puVar8 + (uVar12 / 0xf) * -0x3c);
    puVar10 = puVar10 + 1;
    puVar8 = puVar8 + 4;
    uVar12 = uVar12 + 1;
    glu::CallLogWrapper::glBlendFunci(&local_b8,(GLuint)uVar11,*pGVar1,*pGVar3);
  }
  glu::CallLogWrapper::glBlendFunc(&local_b8,0x302,0x304);
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,0x302,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,0x304,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,iVar6,0x302,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,iVar6,0x304,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommonSeparate","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"After resetting indexed with common separate","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar5,&local_d8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendFuncSeparate(&local_b8,0x300,0x303,0x306,0x305);
  puVar8 = &DAT_00993714;
  uVar12 = 1;
  puVar10 = &DAT_00993710;
  for (uVar11 = 0; GVar9 = (GLuint)uVar11, (int)GVar9 < local_e4; uVar11 = uVar11 + 1) {
    iVar6 = (int)((ulong)((long)(int)(GVar9 + 3) * -0x77777777) >> 0x20) + GVar9 + 3;
    iVar7 = (int)((ulong)((long)(int)(GVar9 + 2) * -0x77777777) >> 0x20) + GVar9 + 2;
    pGVar3 = (GLenum *)(puVar8 + (uVar12 / 0xf) * -0x3c);
    pGVar1 = puVar10 + (uVar11 / 0xf) * -0xf;
    puVar10 = puVar10 + 1;
    puVar8 = puVar8 + 4;
    uVar12 = uVar12 + 1;
    glu::CallLogWrapper::glBlendFuncSeparatei
              (&local_b8,GVar9,
               (&DAT_00993710)[(int)(((iVar6 >> 3) - (iVar6 >> 0x1f)) * -0xf + GVar9 + 3)],
               (&DAT_00993710)[(int)(((iVar7 >> 3) - (iVar7 >> 0x1f)) * -0xf + GVar9 + 2)],*pGVar3,
               *pGVar1);
  }
  glu::CallLogWrapper::glBlendFuncSeparate(&local_b8,0x300,0x303,0x306,0x305);
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c9,iVar6,0x300,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80c8,iVar6,0x303,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80cb,iVar6,0x306,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  if (0 < local_e4) {
    iVar6 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_b8,0x80ca,iVar6,0x305,this->m_verifierType);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_b8);
  return STOP;
}

Assistant:

BlendFuncCase::IterateResult BlendFuncCase::iterate (void)
{
	const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ZERO, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ZERO, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}